

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O2

void __thiscall Blip_Buffer::bass_freq(Blip_Buffer *this,int freq)

{
  ulong uVar1;
  int iVar2;
  
  this->bass_freq_ = freq;
  if (freq < 1) {
    iVar2 = 0x1f;
  }
  else {
    uVar1 = (long)(freq << 0x10) / this->sample_rate_;
    iVar2 = 0xd;
    do {
      if (uVar1 < 2) goto LAB_0055a378;
      uVar1 = (long)uVar1 >> 1;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    iVar2 = 0;
  }
LAB_0055a378:
  this->bass_shift_ = iVar2;
  return;
}

Assistant:

void Blip_Buffer::bass_freq( int freq )
{
	bass_freq_ = freq;
	int shift = 31;
	if ( freq > 0 )
	{
		shift = 13;
		long f = (freq << 16) / sample_rate_;
		while ( (f >>= 1) && --shift ) { }
	}
	bass_shift_ = shift;
}